

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

bool __thiscall kratos::IRNode::has_attribute(IRNode *this,string *value_str)

{
  shared_ptr<kratos::Attribute> *psVar1;
  bool bVar2;
  ulong uVar3;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  __it;
  long lVar4;
  shared_ptr<kratos::Attribute> *psVar5;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  __it_00;
  
  __it_00._M_current =
       (this->attributes_).
       super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->attributes_).
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)psVar1 - (long)__it_00._M_current;
  if (0 < (long)uVar3 >> 6) {
    psVar5 = (shared_ptr<kratos::Attribute> *)
             ((long)&((__it_00._M_current)->
                     super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             (uVar3 & 0xffffffffffffffc0));
    lVar4 = ((long)uVar3 >> 6) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)value_str,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar2) goto LAB_001c0092;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)value_str,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar2) goto LAB_001c0092;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)value_str,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar2) goto LAB_001c0092;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                          *)value_str,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar2) goto LAB_001c0092;
      __it_00._M_current = __it_00._M_current + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
    uVar3 = (long)psVar1 - (long)psVar5;
    __it_00._M_current = psVar5;
  }
  lVar4 = (long)uVar3 >> 4;
  if (lVar4 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar4 != 2) {
      __it._M_current = psVar1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                              *)value_str,__it_00), __it._M_current = __it_00._M_current, bVar2))
      goto LAB_001c0092;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                        *)value_str,__it);
    if (bVar2) goto LAB_001c0092;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                      *)value_str,__it_00);
  __it._M_current = __it_00._M_current;
  if (!bVar2) {
    __it._M_current = psVar1;
  }
LAB_001c0092:
  return __it._M_current != psVar1;
}

Assistant:

bool IRNode::has_attribute(const std::string &value_str) const {
    return std::any_of(attributes_.begin(), attributes_.end(),
                       [&](auto const &attr) { return attr->value_str == value_str; });
}